

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum.cpp
# Opt level: O3

string * __thiscall
pbrt::BlackbodySpectrum::ToString_abi_cxx11_(string *__return_storage_ptr__,BlackbodySpectrum *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::stringPrintfRecursive<float_const&>
            (__return_storage_ptr__,"[ BlackbodySpectrum T: %f ]",&this->T);
  return __return_storage_ptr__;
}

Assistant:

std::string BlackbodySpectrum::ToString() const {
    return StringPrintf("[ BlackbodySpectrum T: %f ]", T);
}